

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::ExtPubkey::ExtPubkey(ExtPubkey *this,ByteData *serialize_data,ByteData256 *tweak_sum)

{
  ByteData *in_stack_ffffffffffffff68;
  ByteData *in_stack_ffffffffffffff70;
  uint32_t *this_00;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  ByteData256 *tweak_sum_local;
  ByteData *serialize_data_local;
  ExtPubkey *this_local;
  
  ByteData::ByteData(&this->serialize_data_);
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  this->child_num_ = 0;
  ByteData256::ByteData256(&this->chaincode_);
  Pubkey::Pubkey(&this->pubkey_);
  ByteData256::ByteData256(&this->tweak_sum_);
  ByteData256::operator=(&this->tweak_sum_,tweak_sum);
  ByteData::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
                     serialize_data);
  this_00 = &this->fingerprint_;
  AnalyzeBip32KeyData((void *)0x0,(string *)0x0,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
                      &this->version_,&this->depth_,&this->child_num_,&this->chaincode_,
                      (Privkey *)0x0,&this->pubkey_,this_00);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  return;
}

Assistant:

ExtPubkey::ExtPubkey(
    const ByteData& serialize_data, const ByteData256& tweak_sum) {
  // unserialize
  tweak_sum_ = tweak_sum;
  serialize_data_ = serialize_data;
  std::vector<uint8_t> data = serialize_data.GetBytes();
  AnalyzeBip32KeyData(
      nullptr, nullptr, &data, &version_, &depth_, &child_num_, &chaincode_,
      nullptr, &pubkey_, &fingerprint_);
}